

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

void __thiscall
IRBuilderAsmJs::BuildDouble1Long1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  IRType type;
  bool bVar2;
  ValueType valueType;
  RegOpnd *this_00;
  RegOpnd *this_01;
  undefined4 *puVar3;
  Instr *instr;
  undefined6 in_register_00000032;
  OpCode opcode;
  int iVar4;
  
  this_00 = BuildDstOpnd(this,dstRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x108);
  iVar4 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar4 == 0x2f) {
    this_01 = BuildSrcOpnd(this,srcRegSlot,TyInt64);
    opcode = Reinterpret_Prim;
  }
  else {
    if (iVar4 == 0x41) {
      type = TyUint64;
    }
    else {
      if (iVar4 != 0x3d) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0xdad,"((0))","(0)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        opcode = Conv_Prim;
        this_01 = (RegOpnd *)0x0;
        goto LAB_004be013;
      }
      type = TyInt64;
    }
    this_01 = BuildSrcOpnd(this,srcRegSlot,type);
    opcode = Conv_Prim;
  }
LAB_004be013:
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,valueType);
  instr = IR::Instr::New(opcode,&this_00->super_Opnd,&this_01->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildDouble1Long1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Conv_Prim;

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
    dstOpnd->SetValueType(ValueType::Float);
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_LTD:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt64);
        break;
    case Js::OpCodeAsmJs::Conv_ULTD:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyUint64);
        break;
    case Js::OpCodeAsmJs::Reinterpret_LTD:
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt64);
        op = Js::OpCode::Reinterpret_Prim;
        break;
    default:
        Assume(UNREACHED);
    }
    srcOpnd->SetValueType(ValueType::GetInt(false));
    IR::Instr* instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}